

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCASerialization.cpp
# Opt level: O2

void __thiscall
Js::SerializationCloner<Js::StreamWriter>::CloneSet
          (SerializationCloner<Js::StreamWriter> *this,Src src,Dst dst)

{
  bool bVar1;
  uint32 data;
  JavascriptSet *this_00;
  Engine *this_01;
  Iterator iter;
  
  this_00 = VarTo<Js::JavascriptSet>(src);
  data = JavascriptSet::Size(this_00);
  Write(this,data);
  JavascriptSet::GetIterator((JavascriptSet *)&stack0xffffffffffffffd0);
  while( true ) {
    bVar1 = MapOrSetDataList<void_*>::Iterator::Next((Iterator *)&stack0xffffffffffffffd0);
    if (!bVar1) break;
    this_01 = ClonerBase<void_*,_unsigned_int,_Js::TypeId,_Js::SerializationCloner<Js::StreamWriter>_>
              ::GetEngine(&this->
                           super_ClonerBase<void_*,_unsigned_int,_Js::TypeId,_Js::SerializationCloner<Js::StreamWriter>_>
                         );
    SCAEngine<void_*,_unsigned_int,_Js::SerializationCloner<Js::StreamWriter>_>::Clone
              (this_01,iter.list.ptr[1].first.ptr);
  }
  return;
}

Assistant:

void SerializationCloner<Writer>::CloneSet(Src src, Dst dst)
    {
        JavascriptSet* set = VarTo<JavascriptSet>(src);

        Write((int32)(set->Size()));

        JavascriptSet::SetDataList::Iterator iter = set->GetIterator();
        while (iter.Next())
        {
            this->GetEngine()->Clone(iter.Current());
        }
    }